

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

xmlParserInputPtr pythonExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  PyObject *pPVar2;
  long *plVar3;
  undefined8 *puVar4;
  xmlParserInputPtr pxVar5;
  char *pcVar6;
  
  if (pythonExternalEntityLoaderObjext != (PyObject *)0x0) {
    pPVar2 = libxml_xmlParserCtxtPtrWrap(ctxt);
    plVar3 = (long *)_PyObject_CallFunction_SizeT
                               (pythonExternalEntityLoaderObjext,"(ssO)",URL,ID,pPVar2);
    if ((pPVar2 != (PyObject *)0x0) &&
       (pPVar2->ob_refcnt = pPVar2->ob_refcnt + -1, pPVar2->ob_refcnt == 0)) {
      _Py_Dealloc(pPVar2);
    }
    if (plVar3 != (long *)0x0) {
      iVar1 = PyObject_HasAttrString(plVar3,"read");
      if ((iVar1 != 0) &&
         (puVar4 = (undefined8 *)xmlAllocParserInputBuffer(0), puVar4 != (undefined8 *)0x0)) {
        *puVar4 = plVar3;
        puVar4[1] = xmlPythonFileReadRaw;
        puVar4[2] = xmlPythonFileCloseRaw;
        pxVar5 = (xmlParserInputPtr)xmlNewIOInputStream(ctxt,puVar4,0);
        if (pxVar5 != (xmlParserInputPtr)0x0) {
          if (URL == (char *)0x0) {
            return pxVar5;
          }
          pcVar6 = (char *)xmlStrdup(URL);
          pxVar5->filename = pcVar6;
          return pxVar5;
        }
      }
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        _Py_Dealloc(plVar3);
      }
    }
  }
  if (defaultExternalEntityLoader == (xmlExternalEntityLoader)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  pxVar5 = (*defaultExternalEntityLoader)(URL,ID,ctxt);
  return pxVar5;
}

Assistant:

static xmlParserInputPtr
pythonExternalEntityLoader(const char *URL, const char *ID,
			   xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr result = NULL;
    if (pythonExternalEntityLoaderObjext != NULL) {
	PyObject *ret;
	PyObject *ctxtobj;

	ctxtobj = libxml_xmlParserCtxtPtrWrap(ctxt);

	ret = PyObject_CallFunction(pythonExternalEntityLoaderObjext,
		      (char *) "(ssO)", URL, ID, ctxtobj);
	Py_XDECREF(ctxtobj);

	if (ret != NULL) {
	    if (PyObject_HasAttrString(ret, (char *) "read")) {
		xmlParserInputBufferPtr buf;

		buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
		if (buf != NULL) {
		    buf->context = ret;
		    buf->readcallback = xmlPythonFileReadRaw;
		    buf->closecallback = xmlPythonFileCloseRaw;
		    result = xmlNewIOInputStream(ctxt, buf,
			                         XML_CHAR_ENCODING_NONE);
		}
#if 0
	    } else {
		if (URL != NULL)
		    printf("pythonExternalEntityLoader: can't read %s\n",
		           URL);
#endif
	    }
	    if (result == NULL) {
		Py_DECREF(ret);
	    } else if (URL != NULL) {
		result->filename = (char *) xmlStrdup((const xmlChar *)URL);
	    }
	}
    }
    if ((result == NULL) && (defaultExternalEntityLoader != NULL)) {
	result = defaultExternalEntityLoader(URL, ID, ctxt);
    }
    return(result);
}